

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O3

string * __thiscall
Quest_Context::SerializeProgress_abi_cxx11_(string *__return_storage_ptr__,Quest_Context *this)

{
  _Rb_tree_node_base *p_Var1;
  _Base_ptr p_Var2;
  int subject;
  _Rb_tree_header *p_Var3;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{","");
  p_Var2 = (this->progress)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->progress)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)(p_Var2 + 1));
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      util::to_string_abi_cxx11_
                (&local_50,(util *)(ulong)(uint)(int)(short)p_Var2[2]._M_color,subject);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(&p_Var3->_M_header);
      if (p_Var2 != p_Var1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Quest_Context::SerializeProgress() const
{
	std::string serialized = "{";

	UTIL_CIFOREACH(this->progress, it)
	{
		serialized += it->first;
		serialized += "=";
		serialized += util::to_string(it->second);

		if (it != std::prev(this->progress.cend()))
		{
			serialized += ",";
		}
	}

	serialized += "}";

	return serialized;
}